

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O2

int hdr_log_read(hdr_log_reader *reader,FILE *file,hdr_histogram **histogram,hdr_timespec *timestamp
                ,hdr_timespec *interval)

{
  int iVar1;
  hdr_log_entry log_entry;
  hdr_log_entry local_58;
  
  local_58.tag = (char *)0x0;
  local_58.tag_len = 0;
  local_58.max.tv_sec = 0;
  local_58.max.tv_nsec = 0;
  local_58.interval.tv_sec = 0;
  local_58.interval.tv_nsec = 0;
  local_58.start_timestamp.tv_sec = 0;
  local_58.start_timestamp.tv_nsec = 0;
  iVar1 = hdr_log_read_entry(reader,file,&local_58,histogram);
  if (iVar1 == 0) {
    if (timestamp != (hdr_timespec *)0x0) {
      timestamp->tv_sec = local_58.start_timestamp.tv_sec;
      timestamp->tv_nsec = local_58.start_timestamp.tv_nsec;
    }
    if (interval != (hdr_timespec *)0x0) {
      interval->tv_sec = local_58.interval.tv_sec;
      interval->tv_nsec = local_58.interval.tv_nsec;
    }
  }
  return iVar1;
}

Assistant:

int hdr_log_read(
    struct hdr_log_reader* reader, FILE* file, struct hdr_histogram** histogram,
    hdr_timespec* timestamp, hdr_timespec* interval)
{
    int result;
    struct hdr_log_entry log_entry;
    memset(&log_entry, 0, sizeof(log_entry));

    result = hdr_log_read_entry(reader, file, &log_entry, histogram);

    if (0 == result)
    {
        if (NULL != timestamp)
        {
            memcpy(timestamp, &log_entry.start_timestamp, sizeof(*timestamp));
        }
        if (NULL != interval)
        {
            memcpy(interval, &log_entry.interval, sizeof(*interval));
        }
    }

    return result;
}